

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans.h
# Opt level: O0

void __thiscall draco::RAnsEncoder<16>::rans_write(RAnsEncoder<16> *this,rans_sym *sym)

{
  uint uVar1;
  int iVar2;
  uint32_t p;
  rans_sym *sym_local;
  RAnsEncoder<16> *this_local;
  
  uVar1 = sym->prob;
  while (uVar1 << 10 <= (this->ans_).state) {
    iVar2 = (this->ans_).buf_offset;
    (this->ans_).buf_offset = iVar2 + 1;
    (this->ans_).buf[iVar2] = (uint8_t)(this->ans_).state;
    (this->ans_).state = (this->ans_).state >> 8;
  }
  (this->ans_).state =
       ((this->ans_).state / uVar1) * 0x10000 + (this->ans_).state % uVar1 + sym->cum_prob;
  return;
}

Assistant:

inline void rans_write(const struct rans_sym *const sym) {
    const uint32_t p = sym->prob;
    while (ans_.state >= l_rans_base / rans_precision * DRACO_ANS_IO_BASE * p) {
      ans_.buf[ans_.buf_offset++] = ans_.state % DRACO_ANS_IO_BASE;
      ans_.state /= DRACO_ANS_IO_BASE;
    }
    ans_.state =
        (ans_.state / p) * rans_precision + ans_.state % p + sym->cum_prob;
  }